

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Matrix<double,_2,_4> * __thiscall
gl4cts::Math::outerProduct<4,2>
          (Matrix<double,_2,_4> *__return_storage_ptr__,Math *this,Vector<double,_2> *left,
          Vector<double,_4> *right)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  Matrix<double,_2,_4> *result;
  bool bVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  undefined8 uVar10;
  double local_68 [4];
  Matrix<double,_2,_4> res;
  
  result = __return_storage_ptr__;
  (__return_storage_ptr__->m_data).m_data[3].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[3].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  lVar7 = 0;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    lVar8 = 0;
    do {
      uVar10 = 0x3ff0000000000000;
      if (lVar7 * 0x10 != lVar8) {
        uVar10 = 0;
      }
      *(undefined8 *)((long)(__return_storage_ptr__->m_data).m_data[0].m_data + lVar8 + lVar7 * 8) =
           uVar10;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x40);
    lVar7 = 1;
    bVar4 = false;
  } while (bVar5);
  dVar9 = *(double *)this;
  dVar2 = *(double *)(this + 8);
  local_68[2] = left[1].m_data[0];
  local_68[3] = left[1].m_data[1];
  local_68[0] = left->m_data[0];
  local_68[1] = left->m_data[1];
  pdVar1 = res.m_data.m_data[0].m_data + 1;
  res.m_data.m_data[3].m_data[0] = 0.0;
  res.m_data.m_data[3].m_data[1] = 0.0;
  res.m_data.m_data[2].m_data[0] = 0.0;
  res.m_data.m_data[2].m_data[1] = 0.0;
  res.m_data.m_data[1].m_data[0] = 0.0;
  res.m_data.m_data[1].m_data[1] = 0.0;
  res.m_data.m_data[0].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  lVar7 = 0;
  pdVar6 = (double *)&res;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    lVar8 = 0;
    do {
      uVar10 = 0x3ff0000000000000;
      if (lVar7 * 0x10 != lVar8) {
        uVar10 = 0;
      }
      *(undefined8 *)((long)pdVar6 + lVar8) = uVar10;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x40);
    lVar7 = 1;
    pdVar6 = pdVar1;
    bVar4 = false;
  } while (bVar5);
  pdVar6 = (double *)&res;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    lVar7 = 0;
    do {
      dVar3 = *(double *)((long)local_68 + lVar7 + 8);
      *(double *)((long)pdVar6 + lVar7 * 2) = *(double *)((long)local_68 + lVar7) * dVar9 + 0.0;
      *(double *)((long)pdVar6 + lVar7 * 2 + 0x10) = dVar3 * dVar9 + 0.0;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x20);
    pdVar6 = pdVar1;
    dVar9 = dVar2;
    bVar4 = false;
  } while (bVar5);
  lVar7 = 0;
  pdVar6 = (double *)&res;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    lVar8 = 0;
    do {
      *(undefined8 *)((long)(__return_storage_ptr__->m_data).m_data[0].m_data + lVar8 + lVar7 * 8) =
           *(undefined8 *)((long)pdVar6 + lVar8);
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x40);
    lVar7 = 1;
    pdVar6 = pdVar1;
    bVar4 = false;
  } while (bVar5);
  return result;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Rows, Cols> outerProduct(const tcu::Vector<glw::GLdouble, Rows>& left,
														   const tcu::Vector<glw::GLdouble, Cols>& right)
{
	tcu::Matrix<glw::GLdouble, Rows, 1>	left_mat;
	tcu::Matrix<glw::GLdouble, 1, Cols>	right_mat;
	tcu::Matrix<glw::GLdouble, Rows, Cols> result;

	for (glw::GLuint i = 0; i < Rows; ++i)
	{
		left_mat(i, 0) = left[i];
	}

	for (glw::GLuint i = 0; i < Cols; ++i)
	{
		right_mat(0, i) = right[i];
	}

	result = left_mat * right_mat;

	return result;
}